

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::formatFuncRets
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,FuncDetail *fd,
                VirtReg **vRegs)

{
  Error EVar1;
  ulong uVar2;
  
  if (fd[0x49] == (FuncDetail)0x0) {
    EVar1 = StringBuilder::_opString(sb,1,"void",0xffffffffffffffff);
    return EVar1;
  }
  uVar2 = 0;
  do {
    if (uVar2 != 0) {
      EVar1 = StringBuilder::_opString(sb,1,", ",0xffffffffffffffff);
      if (EVar1 != 0) {
        return EVar1;
      }
      if (uVar2 != 1) {
        formatFuncRets();
      }
    }
    EVar1 = formatFuncDetailValue(sb,logOptions,emitter,(Value)*(uint32_t *)(fd + uVar2 * 4 + 0x60))
    ;
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 < (byte)fd[0x49]);
  return 0;
}

Assistant:

static Error formatFuncRets(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  const FuncDetail& fd,
  VirtReg* const* vRegs) noexcept {

  if (!fd.hasRet())
    return sb.appendString("void");

  for (uint32_t i = 0; i < fd.getRetCount(); i++) {
    if (i) ASMJIT_PROPAGATE(sb.appendString(", "));
    ASMJIT_PROPAGATE(formatFuncDetailValue(sb, logOptions, emitter, fd.getRet(i)));

#if !defined(ASMJIT_DISABLE_COMPILER)
    if (vRegs)
      ASMJIT_PROPAGATE(sb.appendFormat(" {%s}", vRegs[i]->getName()));
#endif // !ASMJIT_DISABLE_COMPILER
  }

  return kErrorOk;
}